

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O2

void bitVectorSet(BitVector *vector,int i,short val)

{
  undefined6 in_register_00000012;
  
  vector[i >> 6] =
       (long)(int)CONCAT62(in_register_00000012,val) << ((byte)i & 0x3f) |
       vector[i >> 6] & ~(1L << ((ulong)(uint)i & 0x3f));
  return;
}

Assistant:

DD_INLINE
static void
bitVectorSet(
  BitVector * vector,
  int i,
  short val)
{
    int word, bit;

    word = i >> LOGBPL;
    bit = i & (BPL - 1);
    vector[word] &= ~(1L << bit);
    vector[word] |= (((long) val) << bit);

}